

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O2

void mcu8str_append(mcu8str *str,mcu8str *otherstr)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = otherstr->size;
  if (uVar2 != 0) {
    uVar3 = str->size;
    uVar1 = uVar3 + uVar2;
    if (str->buflen <= uVar1) {
      mcu8str_reserve(str,(ulong)uVar1);
      uVar3 = str->size;
      uVar2 = otherstr->size;
    }
    memcpy(str->c_str + uVar3,otherstr->c_str,(ulong)uVar2);
    str->c_str[uVar1] = '\0';
    str->size = uVar1;
  }
  return;
}

Assistant:

void mcu8str_append( mcu8str* str, const mcu8str * otherstr )
  {
    if ( otherstr->size == 0 )
      return;
    mcu8str_size_t newsize = str->size + otherstr->size;
    if ( newsize + 1 > str->buflen )
      mcu8str_reserve( str, newsize );
    //memcpy ok since we handle the null char afterwards, there will be no
    //overlapping even if str==otherstr:
    STDNS memcpy( str->c_str + str->size,
                  otherstr->c_str,
                  otherstr->size );
    str->c_str[newsize] = '\0';
    str->size = (unsigned)newsize;//cast ok, mcu8str_reserve checked.
  }